

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon_entropy.cc
# Opt level: O0

int64_t draco::ComputeShannonEntropy
                  (uint32_t *symbols,int num_symbols,int max_value,int *out_num_unique_symbols)

{
  int iVar1;
  allocator_type *__a;
  reference pvVar2;
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  double dVar4;
  int i_1;
  double num_symbols_d;
  double total_bits;
  int i;
  vector<int,_std::allocator<int>_> symbol_frequencies;
  int num_unique_symbols;
  vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar5;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  double local_58;
  int local_50;
  undefined1 local_3d [33];
  int local_1c;
  int *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_1c = 0;
  __a = (allocator_type *)(long)(in_EDX + 1);
  local_3d._1_4_ = 0;
  this = (vector<int,_std::allocator<int>_> *)local_3d;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x253d18);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
             ,(value_type_conflict1 *)this,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x253d3d);
  for (local_50 = 0; local_50 < local_c; local_50 = local_50 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_3d + 5),
                        (ulong)*(uint *)(local_8 + (long)local_50 * 4));
    *pvVar2 = *pvVar2 + 1;
  }
  local_58 = 0.0;
  dVar3 = (double)local_c;
  for (iVar5 = 0; iVar5 < local_10 + 1; iVar5 = iVar5 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_3d + 5),(long)iVar5);
    if (0 < *pvVar2) {
      local_1c = local_1c + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_3d + 5),(long)iVar5);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_3d + 5),(long)iVar5);
      dVar4 = log2((double)*pvVar2 / dVar3);
      local_58 = (double)iVar1 * dVar4 + local_58;
    }
  }
  if (local_18 != (int *)0x0) {
    *local_18 = local_1c;
  }
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return (long)-local_58;
}

Assistant:

int64_t ComputeShannonEntropy(const uint32_t *symbols, int num_symbols,
                              int max_value, int *out_num_unique_symbols) {
  // First find frequency of all unique symbols in the input array.
  int num_unique_symbols = 0;
  std::vector<int> symbol_frequencies(max_value + 1, 0);
  for (int i = 0; i < num_symbols; ++i) {
    ++symbol_frequencies[symbols[i]];
  }
  double total_bits = 0;
  double num_symbols_d = num_symbols;
  for (int i = 0; i < max_value + 1; ++i) {
    if (symbol_frequencies[i] > 0) {
      ++num_unique_symbols;
      // Compute Shannon entropy for the symbol.
      // We don't want to use std::log2 here for Android build.
      total_bits +=
          symbol_frequencies[i] *
          log2(static_cast<double>(symbol_frequencies[i]) / num_symbols_d);
    }
  }
  if (out_num_unique_symbols) {
    *out_num_unique_symbols = num_unique_symbols;
  }
  // Entropy is always negative.
  return static_cast<int64_t>(-total_bits);
}